

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O3

void __thiscall webrtc::AudioProcessingImpl::UpdateHistogramsOnCallEnd(AudioProcessingImpl *this)

{
  undefined1 *puVar1;
  Histogram *pHVar2;
  Histogram *pHVar3;
  Histogram *pHVar4;
  ostream *poVar5;
  bool bVar6;
  CritScope cs_capture;
  CritScope cs_render;
  CritScope local_1a0;
  CritScope local_198;
  FatalMessage local_190;
  
  rtc::CritScope::CritScope(&local_198,&this->crit_render_);
  rtc::CritScope::CritScope(&local_1a0,&this->crit_capture_);
  if (-1 < (this->capture_).stream_delay_jumps) {
    pHVar3 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
    if (UpdateHistogramsOnCallEnd::atomic_histogram_pointer == (Histogram *)0x0) {
      local_190._0_8_ = &local_190.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps","");
      pHVar3 = metrics::HistogramFactoryGetEnumeration((string *)&local_190,0x33);
      if ((undefined1 *)local_190._0_8_ != &local_190.field_0x10) {
        operator_delete((void *)local_190._0_8_);
      }
      pHVar4 = (Histogram *)0x0;
      LOCK();
      bVar6 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer != (Histogram *)0x0;
      pHVar2 = pHVar3;
      if (bVar6) {
        pHVar4 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
        pHVar2 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
      }
      UpdateHistogramsOnCallEnd::atomic_histogram_pointer = pHVar2;
      UNLOCK();
      if (pHVar3 != pHVar4 && bVar6) {
        rtc::FatalMessage::FatalMessage
                  (&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x528);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_190,
                   "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer",0x4a
                  );
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&local_190);
        std::operator<<(poVar5,"# ");
        goto LAB_00172cdb;
      }
    }
    local_190._0_8_ = &local_190.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps","");
    metrics::HistogramAdd(pHVar3,(string *)&local_190,(this->capture_).stream_delay_jumps);
    if ((undefined1 *)local_190._0_8_ != &local_190.field_0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  (this->capture_).stream_delay_jumps = -1;
  (this->capture_).last_stream_delay_ms = 0;
  if (-1 < (this->capture_).aec_system_delay_jumps) {
    puVar1 = &local_190.field_0x10;
    pHVar3 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
    if (UpdateHistogramsOnCallEnd()::atomic_histogram_pointer == (Histogram *)0x0) {
      local_190._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"WebRTC.Audio.NumOfAecSystemDelayJumps","");
      pHVar3 = metrics::HistogramFactoryGetEnumeration((string *)&local_190,0x33);
      if ((undefined1 *)local_190._0_8_ != puVar1) {
        operator_delete((void *)local_190._0_8_);
      }
      pHVar4 = (Histogram *)0x0;
      LOCK();
      bVar6 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer != (Histogram *)0x0;
      pHVar2 = pHVar3;
      if (bVar6) {
        pHVar4 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
        pHVar2 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
      }
      UpdateHistogramsOnCallEnd()::atomic_histogram_pointer = pHVar2;
      UNLOCK();
      if (pHVar3 != pHVar4 && bVar6) {
        rtc::FatalMessage::FatalMessage
                  (&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x52f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_190,
                   "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer",0x4a
                  );
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&local_190);
        std::operator<<(poVar5,"# ");
LAB_00172cdb:
        rtc::FatalMessage::~FatalMessage(&local_190);
      }
    }
    local_190._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"WebRTC.Audio.NumOfAecSystemDelayJumps","");
    metrics::HistogramAdd(pHVar3,(string *)&local_190,(this->capture_).aec_system_delay_jumps);
    if ((undefined1 *)local_190._0_8_ != puVar1) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  (this->capture_).aec_system_delay_jumps = -1;
  (this->capture_).last_aec_system_delay_ms = 0;
  rtc::CritScope::~CritScope(&local_1a0);
  rtc::CritScope::~CritScope(&local_198);
  return;
}

Assistant:

void AudioProcessingImpl::UpdateHistogramsOnCallEnd() {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

  if (capture_.stream_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION(
        "WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
        capture_.stream_delay_jumps, 51);
  }
  capture_.stream_delay_jumps = -1;
  capture_.last_stream_delay_ms = 0;

  if (capture_.aec_system_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION("WebRTC.Audio.NumOfAecSystemDelayJumps",
                              capture_.aec_system_delay_jumps, 51);
  }
  capture_.aec_system_delay_jumps = -1;
  capture_.last_aec_system_delay_ms = 0;
}